

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O0

void __thiscall zmq::epoll_t::loop(epoll_t *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint64_t uVar4;
  int *piVar5;
  reference pppVar6;
  long in_RDI;
  iterator end;
  iterator it;
  poll_entry_t *pe;
  int i;
  char *errstr;
  int n;
  int timeout;
  epoll_event ev_buf [256];
  poll_entry_t *in_stack_fffffffffffff3a8;
  int __timeout;
  __normal_iterator<zmq::epoll_t::poll_entry_t_**,_std::vector<zmq::epoll_t::poll_entry_t_*,_std::allocator<zmq::epoll_t::poll_entry_t_*>_>_>
  local_c30;
  int *local_c28;
  int local_c1c;
  poller_base_t *in_stack_fffffffffffff3e8;
  epoll_event local_c08 [192];
  
  do {
    while( true ) {
      uVar4 = poller_base_t::execute_timers(in_stack_fffffffffffff3e8);
      __timeout = (int)uVar4;
      iVar2 = poller_base_t::get_load((poller_base_t *)0x1e2d24);
      if (iVar2 == 0) break;
      iVar2 = *(int *)(in_RDI + 0xc0);
      if (__timeout == 0) {
        __timeout = -1;
      }
      iVar3 = epoll_wait(iVar2,local_c08,0x100,__timeout);
      if (iVar3 == -1) {
        piVar5 = __errno_location();
        if (*piVar5 != 4) {
          piVar5 = __errno_location();
          in_stack_fffffffffffff3e8 = (poller_base_t *)strerror(*piVar5);
          fprintf(_stderr,"%s (%s:%d)\n",in_stack_fffffffffffff3e8,
                  "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/epoll.cpp"
                  ,0xbb);
          fflush(_stderr);
          zmq_abort((char *)0x1e2df7);
        }
      }
      else {
        for (local_c1c = 0; local_c1c < iVar3; local_c1c = local_c1c + 1) {
          local_c28 = *(int **)(&local_c08[0].field_0x4 + (long)local_c1c * 0xc);
          if (*local_c28 != -1) {
            if (((&local_c08[0].events)[(long)local_c1c * 3] & 0x18) != 0) {
              (**(code **)(**(long **)(local_c28 + 4) + 0x10))();
            }
            if (*local_c28 != -1) {
              if (((&local_c08[0].events)[(long)local_c1c * 3] & 4) != 0) {
                (**(code **)(**(long **)(local_c28 + 4) + 0x18))();
              }
              if ((*local_c28 != -1) && (((&local_c08[0].events)[(long)local_c1c * 3] & 1) != 0)) {
                (**(code **)(**(long **)(local_c28 + 4) + 0x10))();
              }
            }
          }
        }
        local_c30._M_current =
             (poll_entry_t **)
             std::
             vector<zmq::epoll_t::poll_entry_t_*,_std::allocator<zmq::epoll_t::poll_entry_t_*>_>::
             begin((vector<zmq::epoll_t::poll_entry_t_*,_std::allocator<zmq::epoll_t::poll_entry_t_*>_>
                    *)in_stack_fffffffffffff3a8);
        std::vector<zmq::epoll_t::poll_entry_t_*,_std::allocator<zmq::epoll_t::poll_entry_t_*>_>::
        end((vector<zmq::epoll_t::poll_entry_t_*,_std::allocator<zmq::epoll_t::poll_entry_t_*>_> *)
            in_stack_fffffffffffff3a8);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<zmq::epoll_t::poll_entry_t_**,_std::vector<zmq::epoll_t::poll_entry_t_*,_std::allocator<zmq::epoll_t::poll_entry_t_*>_>_>
                                   *)CONCAT44(iVar2,__timeout),
                                  (__normal_iterator<zmq::epoll_t::poll_entry_t_**,_std::vector<zmq::epoll_t::poll_entry_t_*,_std::allocator<zmq::epoll_t::poll_entry_t_*>_>_>
                                   *)in_stack_fffffffffffff3a8), bVar1) {
          pppVar6 = __gnu_cxx::
                    __normal_iterator<zmq::epoll_t::poll_entry_t_**,_std::vector<zmq::epoll_t::poll_entry_t_*,_std::allocator<zmq::epoll_t::poll_entry_t_*>_>_>
                    ::operator*(&local_c30);
          in_stack_fffffffffffff3a8 = *pppVar6;
          if (in_stack_fffffffffffff3a8 != (poll_entry_t *)0x0) {
            operator_delete(in_stack_fffffffffffff3a8,0x18);
          }
          pppVar6 = __gnu_cxx::
                    __normal_iterator<zmq::epoll_t::poll_entry_t_**,_std::vector<zmq::epoll_t::poll_entry_t_*,_std::allocator<zmq::epoll_t::poll_entry_t_*>_>_>
                    ::operator*(&local_c30);
          *pppVar6 = (poll_entry_t *)0x0;
          __gnu_cxx::
          __normal_iterator<zmq::epoll_t::poll_entry_t_**,_std::vector<zmq::epoll_t::poll_entry_t_*,_std::allocator<zmq::epoll_t::poll_entry_t_*>_>_>
          ::operator++(&local_c30);
        }
        std::vector<zmq::epoll_t::poll_entry_t_*,_std::allocator<zmq::epoll_t::poll_entry_t_*>_>::
        clear((vector<zmq::epoll_t::poll_entry_t_*,_std::allocator<zmq::epoll_t::poll_entry_t_*>_> *
              )0x1e2f79);
      }
    }
  } while (__timeout != 0);
  return;
}

Assistant:

void zmq::epoll_t::loop ()
{
    epoll_event ev_buf[max_io_events];

    while (true) {
        //  Execute any due timers.
        const int timeout = static_cast<int> (execute_timers ());

        if (get_load () == 0) {
            if (timeout == 0)
                break;

            // TODO sleep for timeout
            continue;
        }

        //  Wait for events.
        const int n = epoll_wait (_epoll_fd, &ev_buf[0], max_io_events,
                                  timeout ? timeout : -1);
        if (n == -1) {
            errno_assert (errno == EINTR);
            continue;
        }

        for (int i = 0; i < n; i++) {
            const poll_entry_t *const pe =
              static_cast<const poll_entry_t *> (ev_buf[i].data.ptr);

            if (pe->fd == retired_fd)
                continue;
            if (ev_buf[i].events & (EPOLLERR | EPOLLHUP))
                pe->events->in_event ();
            if (pe->fd == retired_fd)
                continue;
            if (ev_buf[i].events & EPOLLOUT)
                pe->events->out_event ();
            if (pe->fd == retired_fd)
                continue;
            if (ev_buf[i].events & EPOLLIN)
                pe->events->in_event ();
        }

        //  Destroy retired event sources.
        for (retired_t::iterator it = _retired.begin (), end = _retired.end ();
             it != end; ++it) {
            LIBZMQ_DELETE (*it);
        }
        _retired.clear ();
    }
}